

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O0

void storage::BTree::clear_(BTNode *node)

{
  uint uVar1;
  BTNode *node_00;
  void *local_50;
  long *local_38;
  BTLeafNode *nd_1;
  int i;
  BTInnerNode *nd;
  BTNode *node_local;
  
  if (node != (BTNode *)0x0) {
    uVar1 = (**node->_vptr_BTNode)();
    if ((uVar1 & 1) == 0) {
      if (node == (BTNode *)0x0) {
        local_38 = (long *)0x0;
      }
      else {
        local_38 = (long *)__dynamic_cast(node,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
      }
      for (nd_1._4_4_ = 0; nd_1._4_4_ < *(int *)((long)local_38 + 0xdc); nd_1._4_4_ = nd_1._4_4_ + 1
          ) {
        node_00 = (BTNode *)(**(code **)(*local_38 + 8))(local_38,nd_1._4_4_);
        clear_(node_00);
      }
      if (local_38 != (long *)0x0) {
        operator_delete(local_38,0x278);
      }
    }
    else {
      if (node == (BTNode *)0x0) {
        local_50 = (void *)0x0;
      }
      else {
        local_50 = (void *)__dynamic_cast(node,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
      }
      if (local_50 != (void *)0x0) {
        operator_delete(local_50,0x278);
      }
    }
  }
  return;
}

Assistant:

void BTree::clear_(BTNode* node) {
        if (node)
        {
            if (!node->is_leaf_node())
            {
                auto nd = dynamic_cast<BTInnerNode*>(node);
                for (int i = 0; i < nd->used_links_count_; ++i)
                {
                    clear_(nd->get_child(i));
                }
                delete nd;
            }
            else
            {
                auto nd = dynamic_cast<BTLeafNode*>(node);
                delete nd;
            }
        }
    }